

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

bool __thiscall cmGeneratorTarget::IsFortranBuildingInstrinsicModules(cmGeneratorTarget *this)

{
  string_view val;
  bool bVar1;
  string *this_00;
  allocator<char> local_41;
  string local_40;
  cmValue local_20;
  cmValue prop;
  cmGeneratorTarget *this_local;
  
  prop.Value = (string *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"Fortran_BUILDING_INSTRINSIC_MODULES",&local_41);
  local_20 = GetProperty(this,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  bVar1 = cmValue::operator_cast_to_bool(&local_20);
  if (bVar1) {
    this_00 = cmValue::operator*[abi_cxx11_(&local_20);
    val = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)this_00);
    this_local._7_1_ = cmIsOn(val);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool cmGeneratorTarget::IsFortranBuildingInstrinsicModules() const
{
  if (cmValue prop =
        this->GetProperty("Fortran_BUILDING_INSTRINSIC_MODULES")) {
    return cmIsOn(*prop);
  }
  return false;
}